

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

bool __thiscall sentencepiece::ModelProto::IsInitialized(ModelProto *this)

{
  bool bVar1;
  uint uVar2;
  LogMessage *pLVar3;
  TrainerSpec *pTVar4;
  SelfTestData *pSVar5;
  NormalizerSpec *pNVar6;
  LogFinisher local_49;
  LogMessage local_48;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&this->_extensions_);
  if (!bVar1) {
    return false;
  }
  bVar1 = google::protobuf::internal::AllAreInitialized<sentencepiece::ModelProto_SentencePiece>
                    (&this->pieces_);
  if (!bVar1) {
    return false;
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  pTVar4 = this->trainer_spec_;
  if ((pTVar4 == (TrainerSpec *)0x0 & (byte)uVar2) == 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x1241);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_48,"CHECK failed: !value || trainer_spec_ != nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
    pTVar4 = this->trainer_spec_;
LAB_001b5d1a:
    bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&pTVar4->_extensions_);
    if (!bVar1) {
      return false;
    }
    uVar2 = (this->_has_bits_).has_bits_[0];
  }
  else if ((uVar2 & 1) != 0) goto LAB_001b5d1a;
  pNVar6 = this->normalizer_spec_;
  if ((pNVar6 == (NormalizerSpec *)0x0 & (byte)uVar2 >> 1) == 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x1294);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_48,"CHECK failed: !value || normalizer_spec_ != nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
    pNVar6 = this->normalizer_spec_;
LAB_001b5d91:
    bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&pNVar6->_extensions_);
    if (!bVar1) {
      return false;
    }
    uVar2 = (this->_has_bits_).has_bits_[0];
  }
  else if ((uVar2 & 2) != 0) goto LAB_001b5d91;
  pSVar5 = this->self_test_data_;
  if ((pSVar5 == (SelfTestData *)0x0 & (byte)uVar2 >> 2) == 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x12e7);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_48,"CHECK failed: !value || self_test_data_ != nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
    pSVar5 = this->self_test_data_;
  }
  else if ((uVar2 & 4) == 0) goto LAB_001b5e19;
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&pSVar5->_extensions_);
  if (!bVar1) {
    return false;
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
LAB_001b5e19:
  pNVar6 = this->denormalizer_spec_;
  if ((pNVar6 == (NormalizerSpec *)0x0 & (byte)uVar2 >> 3) == 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x133a);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_48,"CHECK failed: !value || denormalizer_spec_ != nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
    pNVar6 = this->denormalizer_spec_;
  }
  else if ((uVar2 & 8) == 0) {
    return true;
  }
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&pNVar6->_extensions_);
  if (bVar1) {
    return true;
  }
  return false;
}

Assistant:

bool ModelProto::IsInitialized() const {
  if (!_extensions_.IsInitialized()) {
    return false;
  }

  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(pieces_)) return false;
  if (_internal_has_trainer_spec()) {
    if (!trainer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_normalizer_spec()) {
    if (!normalizer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_self_test_data()) {
    if (!self_test_data_->IsInitialized()) return false;
  }
  if (_internal_has_denormalizer_spec()) {
    if (!denormalizer_spec_->IsInitialized()) return false;
  }
  return true;
}